

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
dynet::Model::serialize<boost::archive::text_oarchive>(Model *this,text_oarchive *ar,uint param_2)

{
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_std::vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>_>_>
  ::get_instance();
  boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)&this->all_params);
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>_>
  ::get_instance();
  boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)&this->params);
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>_>
  ::get_instance();
  boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)&this->lookup_params);
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_dynet::L2WeightDecay>_>
  ::get_instance();
  boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)this);
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::get_instance();
  boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)&this->updated_params)
  ;
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::get_instance();
  boost::archive::detail::basic_oarchive::save_object
            (ar,(basic_oserializer *)&this->updated_lookup_params);
  return;
}

Assistant:

void Model::serialize(Archive& ar, const unsigned int) {
  ar & all_params;
  ar & params;
  ar & lookup_params;
  ar & weight_decay;
  // TODO do we want to save these or not?
  ar & updated_params;
  ar & updated_lookup_params;
}